

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Constr.c
# Opt level: O0

DdNode * Llb_ManComputeIndCase_rec(Aig_Man_t *p,Aig_Obj_t *pObj,DdManager *dd,Vec_Ptr_t *vBdds)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *bFunc;
  DdNode *bBdd1;
  DdNode *bBdd0;
  Vec_Ptr_t *vBdds_local;
  DdManager *dd_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjId(pObj);
  p_local = (Aig_Man_t *)Vec_PtrEntry(vBdds,iVar1);
  if (p_local == (Aig_Man_t *)0x0) {
    iVar1 = Aig_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Constr.c"
                    ,0x79,
                    "DdNode *Llb_ManComputeIndCase_rec(Aig_Man_t *, Aig_Obj_t *, DdManager *, Vec_Ptr_t *)"
                   );
    }
    pAVar3 = Aig_ObjFanin0(pObj);
    pDVar4 = Llb_ManComputeIndCase_rec(p,pAVar3,dd,vBdds);
    pAVar3 = Aig_ObjFanin1(pObj);
    pDVar5 = Llb_ManComputeIndCase_rec(p,pAVar3,dd,vBdds);
    iVar1 = Aig_ObjFaninC0(pObj);
    iVar2 = Aig_ObjFaninC1(pObj);
    p_local = (Aig_Man_t *)
              Cudd_bddAnd(dd,(DdNode *)((ulong)pDVar4 ^ (long)iVar1),
                          (DdNode *)((ulong)pDVar5 ^ (long)iVar2));
    Cudd_Ref((DdNode *)p_local);
    iVar1 = Aig_ObjId(pObj);
    Vec_PtrWriteEntry(vBdds,iVar1,p_local);
  }
  return (DdNode *)p_local;
}

Assistant:

DdNode * Llb_ManComputeIndCase_rec( Aig_Man_t * p, Aig_Obj_t * pObj, DdManager * dd, Vec_Ptr_t * vBdds )
{
    DdNode * bBdd0, * bBdd1;
    DdNode * bFunc = (DdNode *)Vec_PtrEntry( vBdds, Aig_ObjId(pObj) );
    if ( bFunc != NULL )
        return bFunc;
    assert( Aig_ObjIsNode(pObj) );
    bBdd0 = Llb_ManComputeIndCase_rec( p, Aig_ObjFanin0(pObj), dd, vBdds ); 
    bBdd1 = Llb_ManComputeIndCase_rec( p, Aig_ObjFanin1(pObj), dd, vBdds ); 
    bBdd0 = Cudd_NotCond( bBdd0, Aig_ObjFaninC0(pObj) );
    bBdd1 = Cudd_NotCond( bBdd1, Aig_ObjFaninC1(pObj) );
    bFunc = Cudd_bddAnd( dd, bBdd0, bBdd1 );  Cudd_Ref( bFunc );
    Vec_PtrWriteEntry( vBdds, Aig_ObjId(pObj), bFunc );
    return bFunc;
}